

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintStatsFull(Cba_Ntk_t *p,int fDistrib,int fVerbose)

{
  int iVar1;
  int iVar2;
  Cba_Man_t *pCVar3;
  char *pcVar4;
  int fVerbose_00;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char *pTypeNames [90];
  char *pcStack_2f8;
  undefined8 local_2f0 [89];
  
  Cba_ManCreatePrimMap(&pcStack_2f8);
  pcVar4 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  printf("%-20s : ",pcVar4);
  printf("PI = %4d  ",(ulong)(uint)(p->vInputs).nSize);
  printf("PO = %4d  ",(ulong)(uint)(p->vOutputs).nSize);
  printf("FF = %4d  ",(ulong)(uint)(p->vSeq).nSize);
  printf("Obj = %6d  ",(ulong)((p->vObjType).nSize - 1));
  iVar1 = (p->vObjType).nCap;
  auVar7._8_4_ = iVar1 >> 0x1f;
  auVar7._0_8_ = (long)iVar1;
  auVar7._12_4_ = 0x45300000;
  auVar16._4_4_ = 0;
  auVar16._0_4_ = (p->vObjName).nCap;
  auVar16._8_4_ = (p->vObjAttr).nCap;
  auVar16._12_4_ = 0;
  dVar6 = (double)DAT_00977ca0;
  dVar8 = DAT_00977ca0._8_8_;
  auVar14._4_4_ = 0;
  auVar14._0_4_ = (p->vObjCopy).nCap;
  auVar14._8_4_ = (p->vObjFunc).nCap;
  auVar14._12_4_ = 0;
  auVar18._4_4_ = 0;
  auVar18._0_4_ = (p->vOrder).nCap;
  auVar18._8_4_ = (p->vSeq).nCap;
  auVar18._12_4_ = 0;
  auVar12._4_4_ = 0;
  auVar12._0_4_ = (p->vInputs).nCap;
  auVar12._8_4_ = (p->vOutputs).nCap;
  auVar12._12_4_ = 0;
  auVar19._4_4_ = 0;
  auVar19._0_4_ = (p->vFonName).nCap;
  auVar19._8_4_ = (p->vFonRange).nCap;
  auVar19._12_4_ = 0;
  auVar11._4_4_ = 0;
  auVar11._0_4_ = (p->vAttrSto).nCap;
  auVar11._8_4_ = (p->vFonCopy).nCap;
  auVar11._12_4_ = 0;
  auVar20._4_4_ = 0;
  auVar20._0_4_ = (p->vFinFon).nCap;
  auVar20._8_4_ = (p->vFonObj).nCap;
  auVar20._12_4_ = 0;
  auVar10._4_4_ = 0;
  auVar10._0_4_ = (p->vObjFin0).nCap;
  auVar10._8_4_ = (p->vObjFon0).nCap;
  auVar10._12_4_ = 0;
  auVar17._4_4_ = 0;
  auVar17._0_4_ = (p->vFinFon0).nCap;
  auVar17._8_4_ = (p->vFinObj).nCap;
  auVar17._12_4_ = 0;
  auVar15._4_4_ = 0;
  auVar15._0_4_ = (p->vFonPrev).nCap;
  auVar15._8_4_ = (p->vFonNext).nCap;
  auVar15._12_4_ = 0;
  iVar2 = (p->vArray1).nCap;
  auVar13._8_4_ = iVar2 >> 0x1f;
  auVar13._0_8_ = (long)iVar2;
  auVar13._12_4_ = 0x45300000;
  fVerbose_00 = (int)((SUB168(auVar17 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar15 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar17 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar15 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar20 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar19 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar18 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar16 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar10 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar11 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar12 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar14 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                (int)((SUB168(auVar20 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar19 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar18 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar16 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar10 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar11 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar12 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0) +
                (int)((SUB168(auVar14 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0);
  auVar9._4_4_ = 0;
  auVar9._0_4_ = (p->vNtkObjs).nCap;
  auVar9._8_4_ = (p->vFonBits).nCap;
  auVar9._12_4_ = 0;
  printf("Mem = %.3f MB",
         (double)((int)((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0) + 16.0) + 0x1b0 +
                 (int)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0) * 2
                 + (int)((SUB168(auVar9 | _DAT_00977ca0,8) - dVar8) * 4.0 + 16.0) +
                 fVerbose_00 + (int)((SUB168(auVar9 | _DAT_00977ca0,0) - dVar6) * 4.0 + 16.0)) *
         9.5367431640625e-07);
  putchar(10);
  if (fDistrib == 0) {
    if (fVerbose != 0) {
      puts("Node type statistics:");
      lVar5 = 0;
      do {
        pCVar3 = p->pDesign;
        if (pCVar3->nObjs[lVar5 + 1] != 0) {
          if ((pCVar3->nAnds[0] == 0) || (pCVar3->nAnds[lVar5 + 1] == 0)) {
            printf("%2d  :  %-8s  %6d\n",(ulong)((int)lVar5 + 1),local_2f0[lVar5]);
          }
          else {
            printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                   ((double)pCVar3->nAnds[lVar5 + 1] * 100.0) / (double)pCVar3->nAnds[0],
                   (ulong)((int)lVar5 + 1),local_2f0[lVar5]);
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x59);
    }
  }
  else {
    Cba_NtkPrintDistrib(p,fVerbose_00);
  }
  return;
}

Assistant:

void Cba_NtkPrintStatsFull( Cba_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "%-20s : ",        Cba_NtkName(p) );
    printf( "PI = %4d  ",      Cba_NtkPiNum(p) );
    printf( "PO = %4d  ",      Cba_NtkPoNum(p) );
    printf( "FF = %4d  ",      Cba_NtkBoxSeqNum(p) );
    printf( "Obj = %6d  ",     Cba_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Cba_NtkMemory(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Cba_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < CBA_BOX_LAST; i++ )
    {
        if ( !p->pDesign->nObjs[i] )
            continue;
        if ( p->pDesign->nAnds[0] && p->pDesign->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, pTypeNames[i], p->pDesign->nObjs[i], 100.0*p->pDesign->nAnds[i]/p->pDesign->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, pTypeNames[i], p->pDesign->nObjs[i] );
    }
}